

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatasrc.c
# Opt level: O1

boolean fill_input_buffer(j_decompress_ptr cinfo)

{
  jpeg_source_mgr *pjVar1;
  jpeg_error_mgr *pjVar2;
  size_t sVar3;
  
  pjVar1 = cinfo->src;
  sVar3 = fread((void *)pjVar1[1].bytes_in_buffer,1,0x1000,(FILE *)pjVar1[1].next_input_byte);
  if (sVar3 == 0) {
    if (*(int *)&pjVar1[1].init_source != 0) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x2a;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x78;
    (*pjVar2->emit_message)((j_common_ptr)cinfo,-1);
    *(undefined1 *)pjVar1[1].bytes_in_buffer = 0xff;
    *(undefined1 *)(pjVar1[1].bytes_in_buffer + 1) = 0xd9;
    sVar3 = 2;
  }
  pjVar1->next_input_byte = (JOCTET *)pjVar1[1].bytes_in_buffer;
  pjVar1->bytes_in_buffer = sVar3;
  *(undefined4 *)&pjVar1[1].init_source = 0;
  return 1;
}

Assistant:

METHODDEF(boolean)
fill_input_buffer(j_decompress_ptr cinfo)
{
  my_src_ptr src = (my_src_ptr)cinfo->src;
  size_t nbytes;

  nbytes = JFREAD(src->infile, src->buffer, INPUT_BUF_SIZE);

  if (nbytes <= 0) {
    if (src->start_of_file)     /* Treat empty input file as fatal error */
      ERREXIT(cinfo, JERR_INPUT_EMPTY);
    WARNMS(cinfo, JWRN_JPEG_EOF);
    /* Insert a fake EOI marker */
    src->buffer[0] = (JOCTET)0xFF;
    src->buffer[1] = (JOCTET)JPEG_EOI;
    nbytes = 2;
  }

  src->pub.next_input_byte = src->buffer;
  src->pub.bytes_in_buffer = nbytes;
  src->start_of_file = FALSE;

  return TRUE;
}